

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O2

uint32_t __thiscall
cfd::ConfidentialTransactionContext::AddTxOut
          (ConfidentialTransactionContext *this,ElementsConfidentialAddress *address,Amount *value,
          ConfidentialAssetId *asset,bool remove_nonce)

{
  uint32_t uVar1;
  undefined7 in_register_00000081;
  ByteData nonce;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_a8;
  ConfidentialNonce local_90;
  Script local_68;
  
  cfd::core::ByteData::ByteData((ByteData *)&_Stack_a8);
  if ((int)CONCAT71(in_register_00000081,remove_nonce) == 0) {
    cfd::core::ElementsConfidentialAddress::GetConfidentialKey();
    cfd::core::Pubkey::GetData();
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&_Stack_a8,&local_68);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_90);
  }
  cfd::core::ElementsConfidentialAddress::GetLockingScript();
  cfd::core::ConfidentialNonce::ConfidentialNonce(&local_90,(ByteData *)&_Stack_a8);
  uVar1 = cfd::core::ConfidentialTransaction::AddTxOut
                    ((Amount *)this,(ConfidentialAssetId *)value,(Script *)asset,
                     (ConfidentialNonce *)&local_68);
  core::ConfidentialNonce::~ConfidentialNonce(&local_90);
  core::Script::~Script(&local_68);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_a8);
  return uVar1;
}

Assistant:

uint32_t ConfidentialTransactionContext::AddTxOut(
    const ElementsConfidentialAddress& address, const Amount& value,
    const ConfidentialAssetId& asset, bool remove_nonce) {
  ByteData nonce;
  if (!remove_nonce) {
    nonce = address.GetConfidentialKey().GetData();
  }
  return AddTxOut(
      value, asset, address.GetLockingScript(), ConfidentialNonce(nonce));
}